

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O2

_Bool is_trapped_chest(object *obj)

{
  _Bool _Var1;
  bool bVar2;
  
  _Var1 = tval_is_chest(obj);
  if (_Var1) {
    bVar2 = 1 < obj->pval;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_trapped_chest(const struct object *obj)
{
	if (!tval_is_chest(obj))
		return false;

	/* Disarmed or opened chests are not trapped */
	if (obj->pval <= 0)
		return false;

	/* Some chests simply don't have traps */
	return (obj->pval == 1) ? false : true;
}